

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O1

string * __thiscall
tinyformat::format<std::__cxx11::string,std::__cxx11::string,long>
          (string *__return_storage_ptr__,tinyformat *this,char *fmt,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,long *args_2)

{
  ostringstream oss;
  ostringstream local_200 [112];
  ios_base local_190 [264];
  FormatArg *local_88;
  undefined4 local_80;
  FormatArg local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  code *local_58;
  code *local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  code *local_40;
  code *local_38;
  
  std::__cxx11::ostringstream::ostringstream(local_200);
  local_88 = &local_78;
  local_80 = 3;
  local_78.m_formatImpl = detail::FormatArg::formatImpl<std::__cxx11::string>;
  local_78.m_toIntImpl = detail::FormatArg::toIntImpl<std::__cxx11::string>;
  local_58 = detail::FormatArg::formatImpl<std::__cxx11::string>;
  local_50 = detail::FormatArg::toIntImpl<std::__cxx11::string>;
  local_40 = detail::FormatArg::formatImpl<long>;
  local_38 = detail::FormatArg::toIntImpl<long>;
  local_78.m_value = fmt;
  local_60 = args;
  local_48 = args_1;
  detail::formatImpl((ostream *)local_200,(char *)this,local_88,3);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_200);
  std::ios_base::~ios_base(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string format(const char* fmt, const Args&... args)
{
    std::ostringstream oss;
    format(oss, fmt, args...);
    return oss.str();
}